

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArgumentsTest.cpp
# Opt level: O0

void __thiscall
TEST_CommandLineArguments_checkContinuousIntegrationMode_Test::
~TEST_CommandLineArguments_checkContinuousIntegrationMode_Test
          (TEST_CommandLineArguments_checkContinuousIntegrationMode_Test *this)

{
  TEST_CommandLineArguments_checkContinuousIntegrationMode_Test *this_local;
  
  ~TEST_CommandLineArguments_checkContinuousIntegrationMode_Test(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST(CommandLineArguments, checkContinuousIntegrationMode)
{
    int argc = 2;
    const char* argv[] = { "tests.exe", "-ci" };
    CHECK(newArgumentParser(argc, argv));
    CHECK(!args->isVerbose());
    LONGS_EQUAL(1, args->getRepeatCount());
    CHECK(NULLPTR == args->getGroupFilters());
    CHECK(NULLPTR == args->getNameFilters());
    CHECK(args->isEclipseOutput());
    CHECK(SimpleString("") == args->getPackageName());
    CHECK(!args->isCrashingOnFail());
    CHECK_FALSE(args->isRethrowingExceptions());
}